

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

void VELOCYPACK_XXH3_generateSecret(void *secretBuffer,void *customSeed,size_t customSeedSize)

{
  XXH128_hash_t hash;
  XXH128_hash_t hash_00;
  void *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  XXH128_canonical_t segment;
  size_t segmentStart;
  size_t filled;
  size_t toFill;
  size_t segnb;
  XXH64_hash_t seeds [12];
  XXH128_canonical_t scrambler;
  size_t nbSegments;
  size_t segmentSize;
  void *in_stack_ffffffffffffff08;
  void *__n;
  void *in_stack_ffffffffffffff10;
  void *input;
  undefined8 local_d8;
  undefined8 local_d0;
  void *local_c0;
  ulong local_a0;
  undefined1 local_98 [96];
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  void *local_18;
  void *local_10;
  undefined8 *local_8;
  
  if (in_RDX == (void *)0x0) {
    memcpy(in_RDI,XXH3_kSecret,0xc0);
  }
  else {
    local_20 = 0x10;
    local_28 = 0xc;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    VELOCYPACK_XXH128(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,0x12ac69);
    hash.high64 = (XXH64_hash_t)in_stack_ffffffffffffff10;
    hash.low64 = (XXH64_hash_t)in_stack_ffffffffffffff08;
    VELOCYPACK_XXH128_canonicalFromHash((XXH128_canonical_t *)0x12ac8a,hash);
    local_c0 = local_18;
    if ((void *)0x60 < local_18) {
      local_c0 = (void *)0x60;
    }
    input = local_c0;
    memcpy(local_98,local_10,(size_t)local_c0);
    for (; local_c0 < (void *)0x60; local_c0 = (void *)((long)__n + (long)local_c0)) {
      __n = local_c0;
      if ((void *)(0x60U - (long)local_c0) < local_c0) {
        __n = (void *)(0x60 - (long)local_c0);
      }
      in_stack_ffffffffffffff08 = __n;
      memcpy(local_98 + (long)local_c0,local_98,(size_t)__n);
    }
    *local_8 = local_38;
    local_8[1] = local_30;
    for (local_a0 = 1; local_a0 < 0xc; local_a0 = local_a0 + 1) {
      XXH_readLE64((void *)0x12ad99);
      VELOCYPACK_XXH128(input,(size_t)in_stack_ffffffffffffff08,0x12adb3);
      hash_00.high64 = (XXH64_hash_t)input;
      hash_00.low64 = (XXH64_hash_t)in_stack_ffffffffffffff08;
      VELOCYPACK_XXH128_canonicalFromHash((XXH128_canonical_t *)0x12add1,hash_00);
      local_8[local_a0 * 2] = local_d8;
      local_8[local_a0 * 2 + 1] = local_d0;
    }
  }
  return;
}

Assistant:

XXH_PUBLIC_API void XXH3_generateSecret(void* secretBuffer,
                                        const void* customSeed,
                                        size_t customSeedSize) {
  XXH_ASSERT(secretBuffer != NULL);
  if (customSeedSize == 0) {
    memcpy(secretBuffer, XXH3_kSecret, XXH_SECRET_DEFAULT_SIZE);
    return;
  }
  XXH_ASSERT(customSeed != NULL);

  {
    size_t const segmentSize = sizeof(XXH128_hash_t);
    size_t const nbSegments = XXH_SECRET_DEFAULT_SIZE / segmentSize;
    XXH128_canonical_t scrambler;
    XXH64_hash_t seeds[12];
    size_t segnb;
    XXH_ASSERT(nbSegments == 12);
    XXH_ASSERT(segmentSize * nbSegments ==
               XXH_SECRET_DEFAULT_SIZE); /* exact multiple */
    XXH128_canonicalFromHash(&scrambler, XXH128(customSeed, customSeedSize, 0));

    /*
     * Copy customSeed to seeds[], truncating or repeating as necessary.
     */
    {
      size_t toFill = XXH_MIN(customSeedSize, sizeof(seeds));
      size_t filled = toFill;
      memcpy(seeds, customSeed, toFill);
      while (filled < sizeof(seeds)) {
        toFill = XXH_MIN(filled, sizeof(seeds) - filled);
        memcpy((char*)seeds + filled, seeds, toFill);
        filled += toFill;
      }
    }

    /* generate secret */
    memcpy(secretBuffer, &scrambler, sizeof(scrambler));
    for (segnb = 1; segnb < nbSegments; segnb++) {
      size_t const segmentStart = segnb * segmentSize;
      XXH128_canonical_t segment;
      XXH128_canonicalFromHash(&segment,
                               XXH128(&scrambler, sizeof(scrambler),
                                      XXH_readLE64(seeds + segnb) + segnb));
      memcpy((char*)secretBuffer + segmentStart, &segment, sizeof(segment));
    }
  }
}